

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall
Mesh::Mesh(Mesh *this,vector<float,_std::allocator<float>_> *vertices,
          vector<float,_std::allocator<float>_> *normals,
          vector<float,_std::allocator<float>_> *texCoords,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices,int32_t positionLoc,
          int32_t normalLoc,int32_t texCoordLoc)

{
  bool bVar1;
  size_type sVar2;
  element_type *peVar3;
  undefined1 local_178 [8];
  shared_ptr<IndexBuffer> ibo;
  initializer_list<BufferElement> local_158;
  BufferLayout local_148;
  float *local_128;
  float *local_120;
  undefined1 local_118 [8];
  shared_ptr<VertexBuffer> vboTexels;
  initializer_list<BufferElement> local_f8;
  BufferLayout local_e8;
  float *local_c8;
  float *local_c0;
  undefined1 local_b8 [8];
  shared_ptr<VertexBuffer> vboNormals;
  initializer_list<BufferElement> local_98;
  BufferLayout local_88;
  float *local_58;
  float *local_50;
  undefined1 local_48 [8];
  shared_ptr<VertexBuffer> vboVertices;
  int32_t positionLoc_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices_local;
  vector<float,_std::allocator<float>_> *texCoords_local;
  vector<float,_std::allocator<float>_> *normals_local;
  vector<float,_std::allocator<float>_> *vertices_local;
  Mesh *this_local;
  
  this->m_vertices = 0;
  this->m_indices = 0;
  this->m_positionLoc = positionLoc;
  this->m_normalLoc = normalLoc;
  this->m_texCoordLoc = texCoordLoc;
  vboVertices.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       positionLoc;
  VertexArray::VertexArray(&this->m_vao);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_verticesData);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_normals);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_texCoords);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_indicesData);
  this->m_drawMode = 4;
  sVar2 = std::vector<float,_std::allocator<float>_>::size(vertices);
  this->m_vertices = (uint32_t)(sVar2 / 3);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(vertices);
  local_50 = (float *)(sVar2 << 2);
  local_58 = std::vector<float,_std::allocator<float>_>::data(vertices);
  std::make_shared<VertexBuffer,unsigned_long,float_const*>((unsigned_long *)local_48,&local_50);
  peVar3 = std::__shared_ptr_access<VertexBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VertexBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_48);
  BufferElement::BufferElement
            ((BufferElement *)
             ((long)&vboNormals.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4),Float3,"position",false,0);
  local_98._M_array =
       (iterator)
       ((long)&vboNormals.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi + 4);
  local_98._M_len = 1;
  BufferLayout::BufferLayout(&local_88,&local_98,false);
  VertexBuffer::set_layout(peVar3,&local_88);
  BufferLayout::~BufferLayout(&local_88);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(normals);
  local_c0 = (float *)(sVar2 << 2);
  local_c8 = std::vector<float,_std::allocator<float>_>::data(normals);
  std::make_shared<VertexBuffer,unsigned_long,float_const*>((unsigned_long *)local_b8,&local_c0);
  peVar3 = std::__shared_ptr_access<VertexBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VertexBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_b8);
  BufferElement::BufferElement
            ((BufferElement *)
             ((long)&vboTexels.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4),Float3,"normal",false,0);
  local_f8._M_array =
       (iterator)
       ((long)&vboTexels.super___shared_ptr<VertexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi + 4);
  local_f8._M_len = 1;
  BufferLayout::BufferLayout(&local_e8,&local_f8,false);
  VertexBuffer::set_layout(peVar3,&local_e8);
  BufferLayout::~BufferLayout(&local_e8);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(texCoords);
  local_120 = (float *)(sVar2 << 2);
  local_128 = std::vector<float,_std::allocator<float>_>::data(texCoords);
  std::make_shared<VertexBuffer,unsigned_long,float_const*>((unsigned_long *)local_118,&local_120);
  peVar3 = std::__shared_ptr_access<VertexBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VertexBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_118);
  BufferElement::BufferElement
            ((BufferElement *)
             ((long)&ibo.super___shared_ptr<IndexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 4),Float2,"texCoord",false,0);
  local_158._M_array =
       (iterator)
       ((long)&ibo.super___shared_ptr<IndexBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4
       );
  local_158._M_len = 1;
  BufferLayout::BufferLayout(&local_148,&local_158,false);
  VertexBuffer::set_layout(peVar3,&local_148);
  BufferLayout::~BufferLayout(&local_148);
  VertexArray::add_vertex_buffer(&this->m_vao,(shared_ptr<VertexBuffer> *)local_48,false);
  VertexArray::add_vertex_buffer(&this->m_vao,(shared_ptr<VertexBuffer> *)local_b8,false);
  VertexArray::add_vertex_buffer(&this->m_vao,(shared_ptr<VertexBuffer> *)local_118,false);
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(indices);
  if (!bVar1) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(indices);
    this->m_indices = (uint32_t)sVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(indices);
    std::make_shared<IndexBuffer,unsigned_int&,unsigned_int_const*>
              ((uint *)local_178,(uint **)&this->m_indices);
    VertexArray::set_index_buffer(&this->m_vao,(shared_ptr<IndexBuffer> *)local_178);
    std::shared_ptr<IndexBuffer>::~shared_ptr((shared_ptr<IndexBuffer> *)local_178);
  }
  std::shared_ptr<VertexBuffer>::~shared_ptr((shared_ptr<VertexBuffer> *)local_118);
  std::shared_ptr<VertexBuffer>::~shared_ptr((shared_ptr<VertexBuffer> *)local_b8);
  std::shared_ptr<VertexBuffer>::~shared_ptr((shared_ptr<VertexBuffer> *)local_48);
  return;
}

Assistant:

Mesh::Mesh(const std::vector<float>& vertices,
           const std::vector<float>& normals,
           const std::vector<float>& texCoords,
           const std::vector<uint32_t>& indices,
           int32_t positionLoc,
           int32_t normalLoc  ,
           int32_t texCoordLoc)
  : m_vertices(0),
    m_indices(0),
    m_positionLoc(positionLoc),
    m_normalLoc(normalLoc),
    m_texCoordLoc(texCoordLoc),
    m_drawMode(GL_TRIANGLES)
{
    // Assumes triangles as draw primitive
    m_vertices = vertices.size() / 3;

    // buffer for vertices
    // buffer for normals
    // buffer for texcoords

    auto vboVertices = std::make_shared<VertexBuffer>(
         vertices.size() * sizeof(float), vertices.data());
    vboVertices->set_layout(BufferLayout({{ElementType::Float3, "position"}}));

    auto vboNormals = std::make_shared<VertexBuffer>(
         normals.size() * sizeof(float), normals.data());
    vboNormals->set_layout(BufferLayout({{ElementType::Float3, "normal"}}));

    auto vboTexels = std::make_shared<VertexBuffer>(
        texCoords.size() * sizeof(float), texCoords.data());
    vboTexels->set_layout(BufferLayout({{ElementType::Float2, "texCoord"}}));
 
    m_vao.add_vertex_buffer(vboVertices);
    m_vao.add_vertex_buffer(vboNormals);
    m_vao.add_vertex_buffer(vboTexels);

    if (!indices.empty())
    {
        m_indices = indices.size();
        auto ibo = std::make_shared<IndexBuffer>(m_indices, indices.data());
        m_vao.set_index_buffer(ibo);
    }
}